

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O1

void __thiscall
re2::Prog::ComputeHints
          (Prog *this,vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> *flat,int begin,
          int end)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  long lVar12;
  uint uVar13;
  int iVar14;
  long lVar15;
  Bitmap256 splits;
  int colors [256];
  Bitmap256 local_478;
  long local_450;
  long local_448;
  pointer local_440;
  int aiStack_438 [255];
  int local_3c;
  
  local_478.words_[2] = 0;
  local_478.words_[3] = 0;
  local_478.words_[0] = 0;
  local_478.words_[1] = 0;
  if (begin <= end) {
    lVar12 = (long)end;
    lVar10 = (long)begin;
    bVar5 = false;
    local_448 = lVar12;
    local_450 = lVar10;
    lVar15 = lVar12;
    do {
      iVar14 = (int)lVar15;
      if ((lVar15 == lVar12) ||
         (local_440 = (flat->super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>).
                      _M_impl.super__Vector_impl_data._M_start,
         (local_440[lVar15].out_opcode_ & 7) != 2)) {
        if (bVar5) {
          local_478.words_[2] = 0;
          local_478.words_[3] = 0;
          local_478.words_[0] = 0;
          local_478.words_[1] = 0;
          bVar5 = false;
        }
        local_478.words_[3] = local_478.words_[3] | 0x8000000000000000;
        local_3c = iVar14;
      }
      else {
        bVar1 = local_440[lVar15].field_1.field_3.lo_;
        bVar2 = local_440[lVar15].field_1.field_3.hi_;
        uVar13 = (uint)bVar1;
        if (bVar1 != 0) {
          uVar11 = bVar1 - 1;
          uVar9 = bVar1 + 0x3e;
          if (-1 < (int)uVar11) {
            uVar9 = uVar11;
          }
          if ((local_478.words_[(uint)((int)uVar9 >> 6)] >> ((ulong)uVar11 & 0x3f) & 1) == 0) {
            local_478.words_[(uint)((int)uVar9 >> 6)] =
                 local_478.words_[(uint)((int)uVar9 >> 6)] | 1L << ((byte)uVar11 & 0x3f);
            iVar6 = Bitmap256::FindNextSetBit(&local_478,uVar13);
            aiStack_438[uVar11] = aiStack_438[iVar6];
          }
        }
        iVar6 = end;
        uVar9 = uVar13;
        if ((local_478.words_[bVar2 >> 6] >> ((ulong)bVar2 & 0x3f) & 1) == 0) {
          local_478.words_[bVar2 >> 6] = local_478.words_[bVar2 >> 6] | 1L << (bVar2 & 0x3f);
          iVar7 = Bitmap256::FindNextSetBit(&local_478,bVar2 + 1);
          aiStack_438[bVar2] = aiStack_438[iVar7];
        }
        do {
          if (0xff < (int)uVar9) break;
          uVar11 = Bitmap256::FindNextSetBit(&local_478,uVar9);
          if (aiStack_438[(int)uVar11] < iVar6) {
            iVar6 = aiStack_438[(int)uVar11];
          }
          aiStack_438[(int)uVar11] = iVar14;
          uVar9 = uVar11 + 1;
        } while (uVar11 != bVar2);
        uVar3 = local_440[lVar15].field_1.field_3.hint_foldcase_;
        if (((0x60 < bVar2) && (bVar1 < 0x7b)) && ((uVar3 & 1) != 0)) {
          if (bVar1 < 0x62) {
            uVar13 = 0x61;
          }
          uVar9 = (uint)bVar2;
          if (0x79 < bVar2) {
            uVar9 = 0x7a;
          }
          if (uVar13 <= uVar9) {
            iVar7 = uVar13 - 0x20;
            uVar13 = uVar13 - 0x21;
            if ((local_478.words_[uVar13 >> 6] >> ((ulong)uVar13 & 0x3f) & 1) == 0) {
              local_478.words_[uVar13 >> 6] =
                   local_478.words_[uVar13 >> 6] | 1L << ((byte)uVar13 & 0x3f);
              iVar8 = Bitmap256::FindNextSetBit(&local_478,iVar7);
              aiStack_438[uVar13] = aiStack_438[iVar8];
            }
            uVar11 = uVar9 - 0x20;
            uVar13 = uVar9 + 0x1f;
            if (-1 < (int)uVar11) {
              uVar13 = uVar11;
            }
            if ((local_478.words_[(uint)((int)uVar13 >> 6)] >> ((ulong)uVar11 & 0x3f) & 1) == 0) {
              local_478.words_[(uint)((int)uVar13 >> 6)] =
                   local_478.words_[(uint)((int)uVar13 >> 6)] | 1L << ((byte)uVar11 & 0x3f);
              iVar8 = Bitmap256::FindNextSetBit(&local_478,uVar9 - 0x1f);
              aiStack_438[(int)uVar11] = aiStack_438[iVar8];
            }
            do {
              if (0xff < iVar7) break;
              uVar13 = Bitmap256::FindNextSetBit(&local_478,iVar7);
              if (aiStack_438[(int)uVar13] < iVar6) {
                iVar6 = aiStack_438[(int)uVar13];
              }
              aiStack_438[(int)uVar13] = iVar14;
              iVar7 = uVar13 + 1;
            } while (uVar13 != uVar11);
          }
        }
        bVar5 = true;
        lVar10 = local_450;
        lVar12 = local_448;
        if (iVar6 != end) {
          iVar6 = iVar6 - iVar14;
          if (0x7ffe < iVar6) {
            iVar6 = 0x7fff;
          }
          local_440[lVar15].field_1.field_3.hint_foldcase_ = uVar3 | (short)iVar6 * 2;
        }
      }
      bVar4 = lVar10 < lVar15;
      lVar15 = lVar15 + -1;
    } while (bVar4);
  }
  return;
}

Assistant:

void Prog::Inst::InitAlt(uint32_t out, uint32_t out1) {
  DCHECK_EQ(out_opcode_, 0);
  set_out_opcode(out, kInstAlt);
  out1_ = out1;
}